

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O3

void __thiscall leveldb::Options::Options(Options *this)

{
  Comparator *pCVar1;
  Env *pEVar2;
  
  pCVar1 = BytewiseComparator();
  this->comparator = pCVar1;
  this->create_if_missing = false;
  this->error_if_exists = false;
  this->paranoid_checks = false;
  pEVar2 = Env::Default();
  this->env = pEVar2;
  this->info_log = (Logger *)0x0;
  this->write_buffer_size = 0x400000;
  this->max_open_files = 1000;
  this->block_cache = (Cache *)0x0;
  this->block_size = 0x1000;
  this->block_restart_interval = 0x10;
  this->max_file_size = 0x200000;
  this->compression = kSnappyCompression;
  this->reuse_logs = false;
  this->filter_policy = (FilterPolicy *)0x0;
  return;
}

Assistant:

Options::Options() : comparator(BytewiseComparator()), env(Env::Default()) {}